

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::GetTxOutIndex(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxOutIndexRequestStruct_&)>
  local_58;
  function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxOutIndexRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxOutIndexRequestStruct_const&)>::
  function<cfd::js::api::GetIndexDataStruct(&)(cfd::js::api::GetTxOutIndexRequestStruct_const&),void>
            ((function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxOutIndexRequestStruct_const&)>
              *)&local_38,TransactionStructApi::GetTxOutIndex);
  std::function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxOutIndexRequestStruct_const&)>::
  function<cfd::js::api::GetIndexDataStruct(&)(cfd::js::api::GetTxOutIndexRequestStruct_const&),void>
            ((function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxOutIndexRequestStruct_const&)>
              *)&local_58,ElementsTransactionStructApi::GetTxOutIndex);
  ExecuteElementsCheckApi<cfd::js::api::json::GetTxOutIndexRequest,cfd::js::api::json::GetIndexData,cfd::js::api::GetTxOutIndexRequestStruct,cfd::js::api::GetIndexDataStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxOutIndexRequestStruct_&)>
  ::~function(&local_58);
  std::function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxOutIndexRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::GetTxOutIndex(const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::GetTxOutIndexRequest, api::json::GetIndexData,
      api::GetTxOutIndexRequestStruct, api::GetIndexDataStruct>(
      request_message, TransactionStructApi::GetTxOutIndex,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::GetTxOutIndex);
#else
      TransactionStructApi::GetTxOutIndex);
#endif
}